

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::Gemm_x86_avx::create_pipeline(Gemm_x86_avx *this,Option *opt)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int max_kk;
  undefined8 uVar5;
  undefined8 uVar6;
  int *piVar7;
  _func_int **pp_Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Mat *pMVar13;
  _func_int *p_Var14;
  ulong uVar15;
  int iVar16;
  int j;
  ulong uVar17;
  int iVar18;
  int max_ii;
  int iVar19;
  _func_int *p_Var20;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  undefined4 uStack_84;
  undefined4 uStack_80;
  int iStack_7c;
  size_t local_78;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  int iStack_5c;
  size_t sStack_58;
  int local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  pp_Var8 = this->_vptr_Gemm_x86_avx;
  p_Var20 = pp_Var8[-3];
  if (*(int *)(p_Var20 + 0x40 + (long)&(this->CT_data).data) == 0) {
LAB_004c6704:
    if (*(int *)(p_Var20 + 0x44 + (long)&(this->CT_data).data) != 0) {
      iVar9 = *(int *)(&this->field_0xf0 + (long)p_Var20);
      iVar1 = *(int *)(&this->field_0xf4 + (long)p_Var20);
      get_optimal_tile_mnk
                (0,iVar9,iVar1,*(int *)(&this->field_0x10c + (long)p_Var20),
                 *(int *)(&this->field_0x110 + (long)p_Var20),
                 *(int *)(&this->field_0x114 + (long)p_Var20),&TILE_M,&TILE_N,&TILE_K,
                 opt->num_threads);
      iVar10 = (TILE_N + iVar9 + -1) / TILE_N;
      iVar19 = (iVar1 + TILE_K + -1) / TILE_K;
      Mat::create(&this->BT_data,TILE_K * TILE_N,iVar19,iVar10,4,(Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_004c68d6;
      iVar10 = iVar10 * iVar19;
      if (0 < iVar10) {
        iVar11 = 0;
        do {
          j = TILE_N * (iVar11 / iVar19);
          iVar16 = TILE_K * (int)((long)iVar11 % (long)iVar19);
          iVar18 = iVar9 - j;
          if (TILE_N < iVar9 - j) {
            iVar18 = TILE_N;
          }
          max_kk = iVar1 - iVar16;
          if (TILE_K < iVar1 - iVar16) {
            max_kk = TILE_K;
          }
          sVar2 = (this->BT_data).elemsize;
          pMVar13 = (Mat *)((long)(this->BT_data).data +
                           ((long)iVar11 % (long)iVar19 & 0xffffffffU) * (long)(this->BT_data).w *
                           sVar2 + (long)(iVar11 / iVar19) * (this->BT_data).cstep * sVar2);
          if (*(int *)(this->_vptr_Gemm_x86_avx[-3] + 0x3c + (long)&(this->CT_data).data) == 0) {
            transpose_pack_B_tile
                      ((Mat *)(&this->field_0x160 + (long)this->_vptr_Gemm_x86_avx[-3]),pMVar13,j,
                       iVar18,iVar16,max_kk);
          }
          else {
            pack_B_tile((Mat *)(&this->field_0x160 + (long)this->_vptr_Gemm_x86_avx[-3]),pMVar13,j,
                        iVar18,iVar16,max_kk);
          }
          iVar11 = iVar11 + 1;
        } while (iVar10 != iVar11);
      }
      pp_Var8 = this->_vptr_Gemm_x86_avx;
      if (opt->lightmode != false) {
        p_Var20 = pp_Var8[-3];
        piVar7 = *(int **)(&this->field_0x168 + (long)p_Var20);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (*(long **)(&this->field_0x180 + (long)p_Var20) == (long *)0x0) {
              if (*(void **)(&this->field_0x160 + (long)p_Var20) != (void *)0x0) {
                free(*(void **)(&this->field_0x160 + (long)p_Var20));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var20) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x1a0 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x16c + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x174 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x168 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x188 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x190 + (long)p_Var20) = 0;
        *(undefined4 *)(&this->field_0x198 + (long)p_Var20) = 0;
        pp_Var8 = this->_vptr_Gemm_x86_avx;
      }
      p_Var20 = pp_Var8[-3];
    }
    if (*(int *)(&this->field_0xe8 + (long)p_Var20) != 0) {
      iVar9 = *(int *)(&this->field_0xf8 + (long)p_Var20);
      if (iVar9 != -1) {
        pMVar13 = &this->CT_data;
        p_Var14 = (_func_int *)0xfffffffffffffef8;
        if (p_Var20 != (_func_int *)0xfffffffffffffef8) {
          piVar7 = *(int **)(&this->field_0x1b0 + (long)p_Var20);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = (this->CT_data).refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pvVar3 = (this->CT_data).data;
              pAVar4 = (this->CT_data).allocator;
              if (pAVar4 == (Allocator *)0x0) {
                if (pvVar3 != (void *)0x0) {
                  free(pvVar3);
                }
              }
              else {
                (*pAVar4->_vptr_Allocator[3])();
              }
            }
          }
          (this->CT_data).cstep = 0;
          *(undefined8 *)((long)&(this->CT_data).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->CT_data).elemsize + 4) = 0;
          pMVar13->data = (void *)0x0;
          (this->CT_data).refcount = (int *)0x0;
          (this->CT_data).dims = 0;
          (this->CT_data).w = 0;
          (this->CT_data).h = 0;
          (this->CT_data).d = 0;
          (this->CT_data).c = 0;
          piVar7 = *(int **)((long)(&this->field_0x1a8 + (long)p_Var20) + 8);
          (this->CT_data).data = *(void **)(&this->field_0x1a8 + (long)p_Var20);
          (this->CT_data).refcount = piVar7;
          (this->CT_data).elemsize = *(size_t *)(&this->field_0x1b8 + (long)p_Var20);
          (this->CT_data).elempack = *(int *)(&this->field_0x1c0 + (long)p_Var20);
          (this->CT_data).allocator = *(Allocator **)(&this->field_0x1c8 + (long)p_Var20);
          uVar5 = *(undefined8 *)(&this->field_0x1d0 + (long)p_Var20);
          uVar6 = *(undefined8 *)((long)(&this->field_0x1d0 + (long)p_Var20) + 8);
          (this->CT_data).dims = (int)uVar5;
          (this->CT_data).w = (int)((ulong)uVar5 >> 0x20);
          (this->CT_data).h = (int)uVar6;
          (this->CT_data).d = (int)((ulong)uVar6 >> 0x20);
          (this->CT_data).c = *(int *)(&this->field_0x1e0 + (long)p_Var20);
          (this->CT_data).cstep = *(size_t *)(&this->field_0x1e8 + (long)p_Var20);
          pp_Var8 = this->_vptr_Gemm_x86_avx;
          p_Var14 = pp_Var8[-3];
          iVar9 = *(int *)(&this->field_0xf8 + (long)p_Var14);
        }
        if ((iVar9 == 3) && (opt->use_packing_layout == true)) {
          iVar9 = 8;
          if ((*(uint *)(&this->field_0xec + (long)p_Var14) & 7) != 0) {
            iVar9 = (uint)((*(uint *)(&this->field_0xec + (long)p_Var14) & 3) == 0) * 3 + 1;
          }
          convert_packing((Mat *)(&this->field_0x1a8 + (long)p_Var14),pMVar13,iVar9,opt);
          pp_Var8 = this->_vptr_Gemm_x86_avx;
          p_Var14 = pp_Var8[-3];
        }
        if (*(float *)(p_Var14 + 0x34 + (long)&(this->CT_data).data) != 1.0) {
          local_48 = 0;
          TILE_M = 0;
          uStack_84 = 0;
          uStack_80 = 0;
          local_78 = SUB128(ZEXT812(0),4);
          local_70 = 0;
          local_68 = (Allocator *)0x0;
          iStack_60 = 0;
          local_50 = 0;
          iStack_7c = TILE_M;
          iStack_5c = TILE_M;
          sStack_58 = local_78;
          Mat::create_like((Mat *)&TILE_M,pMVar13,(Allocator *)0x0);
          uVar12 = (this->CT_data).c * (int)(this->CT_data).cstep * (this->CT_data).elempack;
          if (0 < (int)uVar12) {
            pp_Var8 = this->_vptr_Gemm_x86_avx;
            pvVar3 = (this->CT_data).data;
            uVar15 = 0;
            do {
              *(float *)(CONCAT44(uStack_84,TILE_M) + uVar15 * 4) =
                   *(float *)(pp_Var8[-3] + 0x34 + (long)&(this->CT_data).data) *
                   *(float *)((long)pvVar3 + uVar15 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar12 != uVar15);
          }
          piVar7 = (int *)CONCAT44(iStack_7c,uStack_80);
          if (pMVar13 != (Mat *)&TILE_M) {
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = (this->CT_data).refcount;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pvVar3 = (this->CT_data).data;
                pAVar4 = (this->CT_data).allocator;
                if (pAVar4 == (Allocator *)0x0) {
                  if (pvVar3 != (void *)0x0) {
                    free(pvVar3);
                  }
                }
                else {
                  (*pAVar4->_vptr_Allocator[3])();
                }
              }
            }
            piVar7 = (int *)CONCAT44(iStack_7c,uStack_80);
            (this->CT_data).data = (void *)CONCAT44(uStack_84,TILE_M);
            (this->CT_data).refcount = (int *)CONCAT44(iStack_7c,uStack_80);
            (this->CT_data).elemsize = local_78;
            (this->CT_data).elempack = local_70;
            (this->CT_data).allocator = local_68;
            (this->CT_data).dims = iStack_60;
            (this->CT_data).w = iStack_5c;
            (this->CT_data).h = (undefined4)sStack_58;
            (this->CT_data).d = sStack_58._4_4_;
            (this->CT_data).c = local_50;
            (this->CT_data).cstep = local_48;
          }
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_68 == (Allocator *)0x0) {
                if ((void *)CONCAT44(uStack_84,TILE_M) != (void *)0x0) {
                  free((void *)CONCAT44(uStack_84,TILE_M));
                }
              }
              else {
                (*local_68->_vptr_Allocator[3])();
              }
            }
          }
          pp_Var8 = this->_vptr_Gemm_x86_avx;
        }
        if (opt->lightmode == true) {
          p_Var20 = pp_Var8[-3];
          piVar7 = *(int **)(&this->field_0x1b0 + (long)p_Var20);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (*(long **)(&this->field_0x1c8 + (long)p_Var20) == (long *)0x0) {
                if (*(void **)(&this->field_0x1a8 + (long)p_Var20) != (void *)0x0) {
                  free(*(void **)(&this->field_0x1a8 + (long)p_Var20));
                }
              }
              else {
                (**(code **)(**(long **)(&this->field_0x1c8 + (long)p_Var20) + 0x18))();
              }
            }
          }
          *(undefined8 *)(&this->field_0x1e8 + (long)p_Var20) = 0;
          *(undefined8 *)(&this->field_0x1b4 + (long)p_Var20) = 0;
          *(undefined8 *)(&this->field_0x1bc + (long)p_Var20) = 0;
          *(undefined8 *)(&this->field_0x1a8 + (long)p_Var20) = 0;
          *(undefined8 *)(&this->field_0x1b0 + (long)p_Var20) = 0;
          *(undefined8 *)(&this->field_0x1d0 + (long)p_Var20) = 0;
          *(undefined8 *)(&this->field_0x1d8 + (long)p_Var20) = 0;
          *(undefined4 *)(&this->field_0x1e0 + (long)p_Var20) = 0;
          pp_Var8 = this->_vptr_Gemm_x86_avx;
        }
      }
    }
    p_Var20 = pp_Var8[-3];
    if (((*(int *)(p_Var20 + 0x40 + (long)&(this->CT_data).data) != 0) ||
        (*(int *)(p_Var20 + 0x44 + (long)&(this->CT_data).data) != 0)) ||
       (*(int *)(&this->field_0xe8 + (long)p_Var20) != 0)) {
      this->nT = opt->num_threads;
    }
    iVar9 = 0;
  }
  else {
    uVar12 = *(uint *)(&this->field_0xec + (long)p_Var20);
    iVar9 = *(int *)(&this->field_0xf4 + (long)p_Var20);
    get_optimal_tile_mnk
              (uVar12,0,iVar9,*(int *)(&this->field_0x10c + (long)p_Var20),
               *(int *)(&this->field_0x110 + (long)p_Var20),
               *(int *)(&this->field_0x114 + (long)p_Var20),&TILE_M,&TILE_N,&TILE_K,opt->num_threads
              );
    iVar1 = TILE_K;
    local_40 = (ulong)(uint)TILE_M;
    uVar15 = (long)(int)(uVar12 + TILE_M + -1) / (long)TILE_M;
    iVar19 = (int)uVar15;
    local_38 = (ulong)uVar12;
    Mat::create(&this->AT_data,TILE_K * TILE_M,(TILE_K + iVar9 + -1) / TILE_K,iVar19,4,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      if (0 < iVar19) {
        uVar17 = 0;
        do {
          if (0 < iVar9) {
            iVar10 = (int)local_40;
            iVar11 = (int)uVar17 * iVar10;
            iVar19 = (int)local_38 - iVar11;
            if (iVar10 < iVar19) {
              iVar19 = iVar10;
            }
            iVar18 = 0;
            iVar10 = iVar9;
            do {
              iVar16 = iVar10;
              if (iVar1 < iVar10) {
                iVar16 = iVar1;
              }
              sVar2 = (this->AT_data).elemsize;
              pMVar13 = (Mat *)((long)(this->AT_data).data +
                               (long)(this->AT_data).w * sVar2 * (long)(iVar18 / iVar1) +
                               (this->AT_data).cstep * uVar17 * sVar2);
              if (*(int *)(this->_vptr_Gemm_x86_avx[-3] + 0x38 + (long)&(this->CT_data).data) == 0)
              {
                pack_A_tile((Mat *)(&this->field_0x118 + (long)this->_vptr_Gemm_x86_avx[-3]),pMVar13
                            ,iVar11,iVar19,iVar18,iVar16);
              }
              else {
                transpose_pack_A_tile
                          ((Mat *)(&this->field_0x118 + (long)this->_vptr_Gemm_x86_avx[-3]),pMVar13,
                           iVar11,iVar19,iVar18,iVar16);
              }
              iVar18 = iVar18 + iVar1;
              iVar10 = iVar10 - iVar1;
            } while (iVar18 < iVar9);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uVar15 & 0xffffffff));
      }
      pp_Var8 = this->_vptr_Gemm_x86_avx;
      if (opt->lightmode != false) {
        p_Var20 = pp_Var8[-3];
        piVar7 = *(int **)(&this->field_0x120 + (long)p_Var20);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (*(long **)(&this->field_0x138 + (long)p_Var20) == (long *)0x0) {
              if (*(void **)(&this->field_0x118 + (long)p_Var20) != (void *)0x0) {
                free(*(void **)(&this->field_0x118 + (long)p_Var20));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x138 + (long)p_Var20) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x158 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x124 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x12c + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x118 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x120 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x140 + (long)p_Var20) = 0;
        *(undefined8 *)(&this->field_0x148 + (long)p_Var20) = 0;
        *(undefined4 *)(&this->field_0x150 + (long)p_Var20) = 0;
        pp_Var8 = this->_vptr_Gemm_x86_avx;
      }
      p_Var20 = pp_Var8[-3];
      goto LAB_004c6704;
    }
LAB_004c68d6:
    iVar9 = -100;
  }
  return iVar9;
}

Assistant:

int Gemm_x86_avx::create_pipeline(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
        {
            A_data.release();
        }
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
        {
            B_data.release();
        }
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
        {
            C_data.release();
        }
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}